

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDFacePtr __thiscall
ON_SubDEdge::NeighborFacePtr(ON_SubDEdge *this,ON_SubDFace *face,bool bStopAtCrease)

{
  ON_SubDFace *pOVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFace *f [2];
  bool bStopAtCrease_local;
  ON_SubDFace *face_local;
  ON_SubDEdge *this_local;
  
  if ((face == (ON_SubDFace *)0x0) || (this->m_face_count != 2)) {
    this_local = (ON_SubDEdge *)0;
  }
  else if ((bStopAtCrease) && (this->m_edge_tag == Crease)) {
    this_local = (ON_SubDEdge *)0;
  }
  else {
    pOVar2 = (ON_SubDFace *)(this->m_face2[0].m_ptr & 0xfffffffffffffff8);
    pOVar1 = (ON_SubDFace *)(this->m_face2[1].m_ptr & 0xfffffffffffffff8);
    if ((pOVar2 == (ON_SubDFace *)0x0) || (pOVar1 == (ON_SubDFace *)0x0)) {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDEdge *)0;
    }
    else if (face == pOVar2) {
      if (face == pOVar1) {
        ON_SubDIncrementErrorCount();
        this_local = (ON_SubDEdge *)0;
      }
      else {
        this_local = (ON_SubDEdge *)this->m_face2[1].m_ptr;
      }
    }
    else if (face == pOVar1) {
      this_local = (ON_SubDEdge *)this->m_face2[0].m_ptr;
    }
    else {
      ON_SubDIncrementErrorCount();
      this_local = (ON_SubDEdge *)0;
    }
  }
  return (ON_SubDFacePtr)(ON__UINT_PTR)this_local;
}

Assistant:

const ON_SubDFacePtr ON_SubDEdge::NeighborFacePtr(
  const ON_SubDFace* face,
    bool bStopAtCrease
  ) const
{
  if ( nullptr == face || 2 != m_face_count )
    return ON_SubDFacePtr::Null;
  // Do not stop at x tags
  if (bStopAtCrease && ON_SubDEdgeTag::Crease == m_edge_tag)
    return ON_SubDFacePtr::Null;
  const ON_SubDFace* f[2] = { ON_SUBD_FACE_POINTER(m_face2[0].m_ptr), ON_SUBD_FACE_POINTER(m_face2[1].m_ptr) };
  if (nullptr == f[0] || nullptr == f[1] )
    return ON_SUBD_RETURN_ERROR(ON_SubDFacePtr::Null);
  if (face == f[0])
  {
    if (face == f[1] )
      return ON_SUBD_RETURN_ERROR(ON_SubDFacePtr::Null);
    return m_face2[1];
  }
  if (face == f[1])
  {
    return m_face2[0];
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDFacePtr::Null);
}